

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O1

void __thiscall Funcdata::warning(Funcdata *this,string *txt,Address *ad)

{
  CommentDatabase *pCVar1;
  char *pcVar2;
  string msg;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_38 = 0;
  local_30[0] = 0;
  pcVar2 = "WARNING (jumptable): ";
  if (-1 < (char)this->flags) {
    pcVar2 = "WARNING: ";
  }
  local_40 = local_30;
  std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)pcVar2);
  std::__cxx11::string::_M_append((char *)&local_40,(ulong)(txt->_M_dataplus)._M_p);
  pCVar1 = this->glb->commentdb;
  (*pCVar1->_vptr_CommentDatabase[5])(pCVar1,0x10,&this->baseaddr,ad,&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void Funcdata::warning(const string &txt,const Address &ad) const

{
  string msg;
  if ((flags & jumptablerecovery_on)!=0)
    msg = "WARNING (jumptable): ";
  else
    msg = "WARNING: ";
  msg += txt;
  glb->commentdb->addCommentNoDuplicate(Comment::warning,baseaddr,ad,msg);
}